

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_blue
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  bool bVar1;
  color_t cVar2;
  blue_stack_entry_t *pbVar3;
  node_t *pnVar4;
  color_t *pcVar5;
  unsigned_long *puVar6;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar7;
  bool *pbVar8;
  _Elt_pointer pbVar9;
  int iVar10;
  node_sptr_t t;
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>_>
  stack;
  blue_stack_entry_t local_90;
  
  std::
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>>
  ::
  stack<std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>,void>
            (&stack);
  pnVar4 = (node_t *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(n);
  pcVar5 = ndfs::node_t::color(pnVar4);
  *pcVar5 = CYAN;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t(&local_90.n,n);
  expand_node(&local_90.succ,this,ts,graph,n,labels);
  local_90.allred = true;
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
            ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
              *)&stack,&local_90);
  blue_stack_entry_t::~blue_stack_entry_t(&local_90);
  puVar6 = stats_t::visited_states_blue(stats);
  *puVar6 = *puVar6 + 1;
  do {
    if (stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    if (stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        stack.c.
        super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar3 = stack.c.
               super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      pbVar9 = pbVar3 + 4;
      if (pbVar3[4].succ.
          super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          pbVar3[4].succ.
          super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0012eb29;
LAB_0012eac6:
      blue_stack_entry_t::pick_successor((blue_stack_entry_t *)&t);
      puVar6 = stats_t::visited_transitions_blue(stats);
      *puVar6 = *puVar6 + 1;
      pnVar4 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                             *)&t);
      pcVar5 = ndfs::node_t::color(pnVar4);
      if ((*pcVar5 == CYAN) &&
         ((pmVar7 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    ::operator->(&pbVar9->n),
          ((pmVar7->
           super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
           ).super_node_t.super_node_t.super_node_flags_t._flags &
          (pmVar7->
          super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
          ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) != 0 ||
          (pmVar7 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                                  *)&t),
          ((pmVar7->
           super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
           ).super_node_t.super_node_t.super_node_flags_t._flags &
          (pmVar7->
          super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
          ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) != 0)))) {
        pbVar8 = stats_t::cycle(stats);
        *pbVar8 = true;
        bVar1 = false;
        iVar10 = 3;
      }
      else {
        pnVar4 = (node_t *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                               *)&t);
        pcVar5 = ndfs::node_t::color(pnVar4);
        cVar2 = *pcVar5;
        pnVar4 = (node_t *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                               *)&t);
        if (cVar2 == WHITE) {
          pcVar5 = ndfs::node_t::color(pnVar4);
          *pcVar5 = CYAN;
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::intrusive_shared_ptr_t
                    (&local_90.n,
                     (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)&t);
          expand_node(&local_90.succ,this,ts,graph,&t,labels);
          local_90.allred = true;
          std::
          deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
          ::
          emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
                    ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
                      *)&stack,&local_90);
          blue_stack_entry_t::~blue_stack_entry_t(&local_90);
          puVar6 = stats_t::visited_states_blue(stats);
          *puVar6 = *puVar6 + 1;
          iVar10 = 0;
          bVar1 = true;
        }
        else {
          pcVar5 = ndfs::node_t::color(pnVar4);
          iVar10 = 0;
          bVar1 = true;
          if (*pcVar5 != RED) {
            pbVar9->allred = false;
          }
        }
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&t);
      if (bVar1) goto LAB_0012ec99;
    }
    else {
      pbVar9 = stack.c.
               super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      if (stack.c.
          super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].succ.
          super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          stack.c.
          super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].succ.
          super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0012eac6;
LAB_0012eb29:
      bVar1 = pbVar9->allred;
      pnVar4 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(&pbVar9->n);
      if (bVar1 == true) {
        pcVar5 = ndfs::node_t::color(pnVar4);
LAB_0012ebc4:
        *pcVar5 = RED;
      }
      else {
        if (((pnVar4->super_node_flags_t)._flags & (pnVar4->super_node_flags_t).NODE_FINAL) != 0) {
          dfs_red(this,ts,graph,labels,stats,&pbVar9->n);
          pnVar4 = (node_t *)
                   intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                   ::operator->(&pbVar9->n);
          pcVar5 = ndfs::node_t::color(pnVar4);
          goto LAB_0012ebc4;
        }
        pnVar4 = (node_t *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->(&pbVar9->n);
        pcVar5 = ndfs::node_t::color(pnVar4);
        *pcVar5 = BLUE;
      }
      pnVar4 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(&pbVar9->n);
      pcVar5 = ndfs::node_t::color(pnVar4);
      cVar2 = *pcVar5;
      std::
      deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
      ::pop_back(&stack.c);
      if ((cVar2 != RED) &&
         (stack.c.
          super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          stack.c.
          super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        pbVar9 = stack.c.
                 super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (stack.c.
            super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            stack.c.
            super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar9 = stack.c.
                   super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
        }
        pbVar9[-1].allred = false;
      }
LAB_0012ec99:
      iVar10 = 0;
    }
  } while (iVar10 == 0);
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  ::~deque(&stack.c);
  return;
}

Assistant:

void dfs_blue(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
                node_sptr_t & n)
  {
    std::stack<blue_stack_entry_t> stack;

    n->color() = tchecker::algorithms::ndfs::CYAN;
    stack.push(blue_stack_entry_t{n, expand_node(ts, graph, n, labels), true});
    ++stats.visited_states_blue();

    while (!stack.empty()) {
      auto && [s, succ, allred] = stack.top();
      if (succ.empty()) {
        if (allred)
          s->color() = tchecker::algorithms::ndfs::RED;
        else if (s->final()) {
          dfs_red(ts, graph, labels, stats, s);
          s->color() = tchecker::algorithms::ndfs::RED;
        }
        else
          s->color() = tchecker::algorithms::ndfs::BLUE;
        bool s_is_red = (s->color() == tchecker::algorithms::ndfs::RED);
        stack.pop();
        if (!s_is_red && !stack.empty())
          stack.top().allred = false;
      }
      else {
        node_sptr_t t = stack.top().pick_successor();
        ++stats.visited_transitions_blue();
        if (t->color() == tchecker::algorithms::ndfs::CYAN && (s->final() || t->final())) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::WHITE) {
          t->color() = tchecker::algorithms::ndfs::CYAN;
          stack.push(blue_stack_entry_t{t, expand_node(ts, graph, t, labels), true});
          ++stats.visited_states_blue();
        }
        else if (t->color() != tchecker::algorithms::ndfs::RED)
          allred = false;
      }
    }
  }